

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending-c.cpp
# Opt level: O0

bool duckdb_pending_execution_is_finished(duckdb_pending_state pending_state)

{
  undefined4 in_EDI;
  bool local_1;
  
  switch(in_EDI) {
  case 0:
    local_1 = duckdb::PendingQueryResult::IsResultReady(RESULT_READY);
    break;
  case 1:
    local_1 = duckdb::PendingQueryResult::IsResultReady(RESULT_READY);
    break;
  case 2:
    local_1 = duckdb::PendingQueryResult::IsResultReady(RESULT_READY);
    break;
  case 3:
    local_1 = duckdb::PendingQueryResult::IsResultReady(RESULT_READY);
    break;
  default:
    local_1 = duckdb::PendingQueryResult::IsResultReady(RESULT_READY);
  }
  return local_1;
}

Assistant:

bool duckdb_pending_execution_is_finished(duckdb_pending_state pending_state) {
	switch (pending_state) {
	case DUCKDB_PENDING_RESULT_READY:
		return PendingQueryResult::IsResultReady(PendingExecutionResult::RESULT_READY);
	case DUCKDB_PENDING_NO_TASKS_AVAILABLE:
		return PendingQueryResult::IsResultReady(PendingExecutionResult::NO_TASKS_AVAILABLE);
	case DUCKDB_PENDING_RESULT_NOT_READY:
		return PendingQueryResult::IsResultReady(PendingExecutionResult::RESULT_NOT_READY);
	case DUCKDB_PENDING_ERROR:
		return PendingQueryResult::IsResultReady(PendingExecutionResult::EXECUTION_ERROR);
	default:
		return PendingQueryResult::IsResultReady(PendingExecutionResult::EXECUTION_ERROR);
	}
}